

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O3

Vec_Int_t * Bac_NtkDfs(Bac_Ntk_t *p)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *vBoxes;
  int *piVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  iVar2 = (p->vType).nSize;
  if ((long)iVar2 < 1) {
    iVar3 = 0;
  }
  else {
    lVar7 = 0;
    iVar3 = 0;
    do {
      bVar1 = (p->vType).pArray[lVar7];
      if ((char)bVar1 < '\0') {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      iVar3 = iVar3 + (uint)(bVar1 < 10);
      lVar7 = lVar7 + 1;
    } while (iVar2 != lVar7);
  }
  vBoxes = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < (iVar2 - iVar3) - 1U) {
    iVar6 = iVar2 - iVar3;
  }
  vBoxes->nSize = 0;
  vBoxes->nCap = iVar6;
  if (iVar6 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar6 << 2);
  }
  vBoxes->pArray = piVar4;
  iVar2 = (p->vType).nCap;
  lVar7 = (long)iVar2;
  if (lVar7 == 0) {
    __assert_fail("Bac_NtkObjNumAlloc(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                  ,0xfe,"void Bac_NtkStartCopies(Bac_Ntk_t *)");
  }
  if ((p->vCopy).nCap < iVar2) {
    piVar4 = (p->vCopy).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(lVar7 * 4);
    }
    else {
      piVar4 = (int *)realloc(piVar4,lVar7 * 4);
    }
    (p->vCopy).pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopy).nCap = iVar2;
  }
  if (0 < iVar2) {
    memset((p->vCopy).pArray,0xff,lVar7 << 2);
  }
  (p->vCopy).nSize = iVar2;
  if (0 < (p->vInputs).nSize) {
    lVar7 = 0;
    do {
      iVar2 = (p->vInputs).pArray[lVar7];
      if (((long)iVar2 < 0) || ((p->vCopy).nSize <= iVar2)) goto LAB_003bbcc8;
      if ((p->vCopy).pArray[iVar2] != -1) {
        __assert_fail("Bac_ObjCopy(p, i) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0x12d,"void Bac_ObjSetCopy(Bac_Ntk_t *, int, int)");
      }
      Vec_IntSetEntry(&p->vCopy,iVar2,1);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (p->vInputs).nSize);
  }
  if (0 < (p->vOutputs).nSize) {
    lVar7 = 0;
    do {
      iVar2 = (p->vOutputs).pArray[lVar7];
      lVar5 = (long)iVar2;
      if ((lVar5 < 0) || ((p->vType).nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if (((p->vType).pArray[lVar5] & 0xfcU) != 4) {
        __assert_fail("Bac_ObjIsCo(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0x11d,"int Bac_ObjFanin(Bac_Ntk_t *, int)");
      }
      if ((p->vFanin).nSize <= iVar2) {
LAB_003bbcc8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Bac_NtkDfs_rec(p,(p->vFanin).pArray[lVar5],vBoxes);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (p->vOutputs).nSize);
  }
  return vBoxes;
}

Assistant:

Vec_Int_t * Bac_NtkDfs( Bac_Ntk_t * p )
{
    int i, iObj;
    Vec_Int_t * vBoxes = Vec_IntAlloc( Bac_NtkBoxNum(p) );
    Bac_NtkStartCopies( p ); // -1 = not visited; 1 = finished
    Bac_NtkForEachPi( p, iObj, i )
        Bac_ObjSetCopy( p, iObj, 1 );
    Bac_NtkForEachPo( p, iObj, i )
        Bac_NtkDfs_rec( p, Bac_ObjFanin(p, iObj), vBoxes );
    return vBoxes;
}